

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall jsonnet::internal::FixPlusObject::visitExpr(FixPlusObject *this,AST **expr)

{
  AST *in_RAX;
  long lVar1;
  long lVar2;
  long lVar3;
  ApplyBrace *pAVar4;
  AST *rhs;
  AST *local_28;
  
  local_28 = in_RAX;
  if (*expr != (AST *)0x0) {
    lVar1 = __dynamic_cast(*expr,&AST::typeinfo,&Binary::typeinfo,0);
    if ((lVar1 != 0) && (lVar3 = *(long *)(lVar1 + 0x80), lVar3 != 0)) {
      lVar2 = __dynamic_cast(lVar3,&AST::typeinfo,&Var::typeinfo,0);
      if (lVar2 == 0) {
        lVar3 = __dynamic_cast(lVar3,&AST::typeinfo,&Index::typeinfo,0);
        if (lVar3 == 0) goto LAB_001ef9da;
      }
      if (*(long *)(lVar1 + 0xa8) != 0) {
        local_28 = (AST *)__dynamic_cast(*(long *)(lVar1 + 0xa8),&AST::typeinfo,&Object::typeinfo,0)
        ;
        if ((local_28 != (AST *)0x0) && (*(int *)(lVar1 + 0xa0) == 3)) {
          fodder_move_front(&local_28->openFodder,(Fodder *)(lVar1 + 0x88));
          pAVar4 = Allocator::
                   make<jsonnet::internal::ApplyBrace,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,jsonnet::internal::AST*&>
                             ((this->super_FmtPass).super_CompilerPass.alloc,
                              (LocationRange *)(lVar1 + 8),
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(lVar1 + 0x50),(AST **)(lVar1 + 0x80),&local_28);
          *expr = &pAVar4->super_AST;
        }
      }
    }
  }
LAB_001ef9da:
  CompilerPass::visitExpr((CompilerPass *)this,expr);
  return;
}

Assistant:

void visitExpr(AST *&expr)
    {
        if (auto *bin_op = dynamic_cast<Binary *>(expr)) {
            // Could relax this to allow more ASTs on the LHS but this seems OK for now.
            if (dynamic_cast<Var *>(bin_op->left) || dynamic_cast<Index *>(bin_op->left)) {
                if (AST *rhs = dynamic_cast<Object *>(bin_op->right)) {
                    if (bin_op->op == BOP_PLUS) {
                        fodder_move_front(rhs->openFodder, bin_op->opFodder);
                        expr = alloc.make<ApplyBrace>(
                            bin_op->location, bin_op->openFodder, bin_op->left, rhs);
                    }
                }
            }
        }
        FmtPass::visitExpr(expr);
    }